

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O3

NDSTATUS NdFetchAddressFar(INSTRUX *Instrux,ND_UINT8 *Code,ND_UINT8 Offset,ND_SIZET Size,
                          ND_UINT8 AddressSize)

{
  NDSTATUS NVar1;
  ND_UINT64 NVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  undefined3 in_register_00000081;
  byte bVar4;
  ulong uVar5;
  
  uVar3 = CONCAT71(in_register_00000011,Offset) & 0xffffffff;
  NVar1 = 0x80000001;
  if (CONCAT31(in_register_00000081,AddressSize) + uVar3 <= Size) {
    Instrux->field_0x6 = Instrux->field_0x6 | 0x40;
    uVar5 = (ulong)((uint)CONCAT71(in_register_00000011,Offset) & 0xf) << 0x34 |
            (ulong)((AddressSize & 0xf) << 0x14) |
            *(ulong *)&Instrux->field_0xc & 0xff0fffffff0fffff;
    *(ulong *)&Instrux->field_0xc = uVar5;
    NVar2 = NdFetchData(Code + uVar3,(AddressSize & 0xf) - 2);
    uVar5 = uVar5 >> 0x14;
    (Instrux->field_74).Displacement = (ND_UINT32)NVar2;
    (Instrux->field_74).Address.Cs = *(ND_UINT16 *)(Code + uVar3 + ((ulong)((uint)uVar5 & 0xf) - 2))
    ;
    bVar4 = ((byte)uVar5 & 0xf) + Instrux->Length;
    Instrux->Length = bVar4;
    NVar1 = 0x80000003;
    if (bVar4 < 0x10) {
      NVar1 = 0;
    }
  }
  return NVar1;
}

Assistant:

static NDSTATUS
NdFetchAddressFar(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_UINT8 Offset,
    ND_SIZET Size,
    ND_UINT8 AddressSize
    )
{
    RET_GT((ND_SIZET)Offset + AddressSize, Size, ND_STATUS_BUFFER_TOO_SMALL);

    Instrux->HasAddr = ND_TRUE;
    Instrux->AddrLength = AddressSize;
    Instrux->AddrOffset = Offset;

    Instrux->Address.Ip = (ND_UINT32)NdFetchData(Code + Offset, Instrux->AddrLength - 2);
    Instrux->Address.Cs = (ND_UINT16)NdFetchData(Code + Offset + Instrux->AddrLength - 2, 2);

    Instrux->Length += Instrux->AddrLength;
    if (Instrux->Length > ND_MAX_INSTRUCTION_LENGTH)
    {
        return ND_STATUS_INSTRUCTION_TOO_LONG;
    }

    return ND_STATUS_SUCCESS;
}